

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovalsTests.cpp
# Opt level: O0

void __thiscall
TEST_ApprovalTestsGroup_YouCanVerifyText_Test::testBody
          (TEST_ApprovalTestsGroup_YouCanVerifyText_Test *this)

{
  Options *this_00;
  Options *local_78;
  undefined8 uStack_70;
  Options *options;
  undefined8 contents;
  
  options = (Options *)0x0;
  contents = (char (*) [12])0x0;
  local_78 = (Options *)0x0;
  uStack_70._0_1_ = (_Alloc_hider)0x0;
  uStack_70._1_7_ = 0;
  this_00 = (Options *)&local_78;
  ApprovalTests::Options::Options((Options *)0x0);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
  verify<char[12],int>((char (*) [12])contents,options);
  ApprovalTests::Options::~Options(this_00);
  return;
}

Assistant:

TEST(ApprovalTestsGroup, YouCanVerifyText)
{
    //std::cout << __FILE__ << std::endl;
    Approvals::verify("My objects!");
}